

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.cpp
# Opt level: O2

string * __thiscall
arguments_t::operator[][abi_cxx11_(string *__return_storage_ptr__,arguments_t *this,int index)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             ((this->parameters).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + index));
  return __return_storage_ptr__;
}

Assistant:

std::string arguments_t::operator[](int index) const {
    return this->parameters[index];
}